

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs-libc.c
# Opt level: O0

JSValue js_printf_internal(JSContext *ctx,int argc,JSValue *argv,FILE *fp)

{
  byte bVar1;
  byte bVar2;
  JSValue val1;
  JSValue val1_00;
  JSValue val;
  JSValue JVar3;
  int iVar4;
  BOOL BVar5;
  size_t sVar6;
  FILE *in_RCX;
  byte *pbVar7;
  long in_RDX;
  byte *__s;
  int in_ESI;
  JSContext *in_RDI;
  JSValue JVar8;
  _func_int_DynBuf_ptr_char_ptr_varargs *dbuf_printf_fun;
  char *string_arg;
  double double_arg;
  int64_t int64_arg;
  int32_t int32_arg;
  size_t fmt_len;
  int mod;
  int len;
  int c;
  int i;
  char *q;
  uint8_t *p;
  uint8_t *fmt_end;
  uint8_t *fmt;
  char *fmt_str;
  DynBuf dbuf;
  JSValue res;
  uint8_t cbuf [7];
  char fmtbuf [32];
  uint7 in_stack_fffffffffffffe78;
  undefined1 in_stack_fffffffffffffe7f;
  uint7 in_stack_fffffffffffffe80;
  undefined1 in_stack_fffffffffffffe87;
  undefined1 uVar9;
  JSValueUnion in_stack_fffffffffffffe88;
  JSContext *in_stack_fffffffffffffe90;
  double *in_stack_fffffffffffffe98;
  JSContext *in_stack_fffffffffffffea0;
  JSValue in_stack_fffffffffffffea8;
  undefined1 in_stack_fffffffffffffec8 [16];
  size_t buf_len;
  code *buf;
  JSContext *in_stack_fffffffffffffee0;
  undefined8 local_118;
  ulong local_110;
  uint local_104;
  long local_100;
  int local_ec;
  byte *local_e8;
  byte *local_e0;
  byte *local_d8;
  byte *local_d0;
  byte *local_c8;
  void *local_c0;
  size_t local_b8;
  int in_stack_ffffffffffffff58;
  JSValueUnion local_90;
  int64_t local_88;
  uint8_t local_7f [7];
  byte local_78;
  byte local_77 [30];
  byte bStack_59;
  undefined1 auStack_58 [8];
  FILE *local_50;
  long local_48;
  int local_3c;
  JSContext *local_38;
  int32_t local_30;
  undefined4 uStack_2c;
  int64_t local_28;
  undefined4 local_1c;
  JSContext *local_18;
  undefined4 local_10;
  undefined4 uStack_c;
  undefined8 local_8;
  
  buf = dbuf_printf;
  local_50 = in_RCX;
  local_48 = in_RDX;
  local_3c = in_ESI;
  local_38 = in_RDI;
  js_std_dbuf_init((JSContext *)CONCAT17(in_stack_fffffffffffffe87,in_stack_fffffffffffffe80),
                   (DynBuf *)CONCAT17(in_stack_fffffffffffffe7f,in_stack_fffffffffffffe78));
  buf_len = in_stack_fffffffffffffec8._8_8_;
  if (0 < local_3c) {
    JVar8.tag = (int64_t)in_stack_fffffffffffffe90;
    JVar8.u.ptr = in_stack_fffffffffffffe88.ptr;
    local_c8 = (byte *)JS_ToCStringLen((JSContext *)
                                       CONCAT17(in_stack_fffffffffffffe87,in_stack_fffffffffffffe80)
                                       ,(size_t *)
                                        CONCAT17(in_stack_fffffffffffffe7f,in_stack_fffffffffffffe78
                                                ),JVar8);
    if (local_c8 == (byte *)0x0) {
LAB_0011044b:
      dbuf_free((DynBuf *)0x110458);
      local_30 = 0;
      local_28 = 6;
      goto LAB_0011046f;
    }
    local_ec = 1;
    local_d8 = local_c8 + local_100;
    local_d0 = local_c8;
LAB_0010f994:
    buf_len = in_stack_fffffffffffffec8._8_8_;
    if (local_d0 < local_d8) {
      local_e0 = local_d0;
      while( true ) {
        uVar9 = false;
        if (local_d0 < local_d8) {
          uVar9 = *local_d0 != 0x25;
        }
        if ((bool)uVar9 == false) break;
        local_d0 = local_d0 + 1;
      }
      dbuf_put((DynBuf *)in_stack_fffffffffffffe88.ptr,(uint8_t *)(ulong)in_stack_fffffffffffffe80,
               CONCAT17(in_stack_fffffffffffffe7f,in_stack_fffffffffffffe78));
      buf_len = in_stack_fffffffffffffec8._8_8_;
      if (local_d8 <= local_d0) goto LAB_001102de;
      local_78 = *local_d0;
      local_e8 = local_77;
      while( true ) {
        local_d0 = local_d0 + 1;
        bVar1 = *local_d0;
        if ((((bVar1 != 0x30) && (bVar1 != 0x23)) && (bVar1 != 0x2b)) &&
           (((bVar1 != 0x2d && (bVar1 != 0x20)) && (bVar1 != 0x27)))) break;
        if (&bStack_59 <= local_e8) goto LAB_0011028f;
        *local_e8 = bVar1;
        local_e8 = local_e8 + 1;
      }
      if (*local_d0 == 0x2a) {
        if (local_3c <= local_ec) goto LAB_001102b4;
        local_ec = local_ec + 1;
        iVar4 = JS_ToInt32(in_stack_fffffffffffffea0,(int32_t *)in_stack_fffffffffffffe98,
                           in_stack_fffffffffffffea8);
        if (iVar4 == 0) {
          iVar4 = snprintf((char *)local_e8,(size_t)(auStack_58 + -(long)local_e8),"%d",
                           (ulong)local_104);
          local_e8 = local_e8 + iVar4;
          local_d0 = local_d0 + 1;
          goto LAB_0010fc7e;
        }
        goto LAB_0011044b;
      }
      while (BVar5 = my_isdigit((uint)*local_d0), BVar5 != 0) {
        if (&bStack_59 <= local_e8) goto LAB_0011028f;
        *local_e8 = *local_d0;
        local_e8 = local_e8 + 1;
        local_d0 = local_d0 + 1;
      }
LAB_0010fc7e:
      if (*local_d0 == 0x2e) {
        if (&bStack_59 <= local_e8) goto LAB_0011028f;
        pbVar7 = local_d0 + 1;
        __s = local_e8 + 1;
        *local_e8 = *local_d0;
        local_e8 = __s;
        local_d0 = pbVar7;
        if (*pbVar7 != 0x2a) {
          while (BVar5 = my_isdigit((uint)*local_d0), BVar5 != 0) {
            if (&bStack_59 <= local_e8) goto LAB_0011028f;
            *local_e8 = *local_d0;
            local_e8 = local_e8 + 1;
            local_d0 = local_d0 + 1;
          }
          goto LAB_0010fe2d;
        }
        if (local_3c <= local_ec) goto LAB_001102b4;
        local_ec = local_ec + 1;
        iVar4 = JS_ToInt32(in_stack_fffffffffffffea0,(int32_t *)in_stack_fffffffffffffe98,
                           in_stack_fffffffffffffea8);
        if (iVar4 != 0) goto LAB_0011044b;
        iVar4 = snprintf((char *)__s,(size_t)(auStack_58 + -(long)__s),"%d",(ulong)local_104);
        local_e8 = __s + iVar4;
        local_d0 = local_d0 + 1;
      }
LAB_0010fe2d:
      bVar1 = 0x20;
      if (*local_d0 == 0x6c) {
        bVar1 = *local_d0;
        local_d0 = local_d0 + 1;
      }
      pbVar7 = local_d0 + 1;
      bVar2 = *local_d0;
      local_d0 = pbVar7;
      if (&bStack_59 <= local_e8) goto LAB_0011028f;
      pbVar7 = local_e8 + 1;
      *local_e8 = bVar2;
      *pbVar7 = 0;
      in_stack_fffffffffffffe78 = CONCAT34(0,bVar2 - 0x25);
      in_stack_fffffffffffffe7f = 0;
      switch(in_stack_fffffffffffffe78) {
      case 0:
        dbuf_putc((DynBuf *)CONCAT17(uVar9,in_stack_fffffffffffffe80),'\0');
        goto LAB_0010f994;
      default:
        break;
      case 0x1c:
      case 0x20:
      case 0x21:
      case 0x22:
      case 0x3c:
      case 0x40:
      case 0x41:
      case 0x42:
        if (local_3c <= local_ec) goto LAB_001102b4;
        local_ec = local_ec + 1;
        iVar4 = JS_ToFloat64(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,
                             in_stack_fffffffffffffea8);
        if (iVar4 != 0) goto LAB_0011044b;
        (*buf)(local_118,&local_c0,&local_78);
        goto LAB_0010f994;
      case 0x33:
      case 0x3f:
      case 0x44:
      case 0x4a:
      case 0x50:
      case 0x53:
        if (local_3c <= local_ec) goto LAB_001102b4;
        local_ec = local_ec + 1;
        val.u._7_1_ = uVar9;
        val.u._0_7_ = in_stack_fffffffffffffe80;
        val.tag = (int64_t)in_stack_fffffffffffffe88.ptr;
        iVar4 = JS_ToInt64Ext((JSContext *)(ulong)in_stack_fffffffffffffe78,(int64_t *)0x1100b2,val)
        ;
        if (iVar4 != 0) goto LAB_0011044b;
        if (bVar1 != 0x6c) {
          (*buf)(&local_c0,&local_78,local_110 & 0xffffffff);
          goto LAB_0010f994;
        }
        if (pbVar7 < local_77 + 0x1d) {
          local_e8[2] = *local_e8;
          *pbVar7 = 0x6c;
          *local_e8 = 0x6c;
          local_e8[3] = 0;
          (*buf)(&local_c0,&local_78,local_110);
          goto LAB_0010f994;
        }
        break;
      case 0x3e:
        if (local_3c <= local_ec) {
LAB_001102b4:
          JS_ThrowReferenceError(local_38,"missing argument for conversion specifier");
          goto LAB_0011044b;
        }
        iVar4 = JS_IsString(*(JSValue *)(local_48 + (long)local_ec * 0x10));
        if (iVar4 == 0) {
          iVar4 = JS_ToInt32(in_stack_fffffffffffffea0,(int32_t *)in_stack_fffffffffffffe98,
                             in_stack_fffffffffffffea8);
          if (iVar4 != 0) goto LAB_0011044b;
        }
        else {
          val1.u._7_1_ = in_stack_fffffffffffffe7f;
          val1.u._0_7_ = in_stack_fffffffffffffe78;
          val1.tag._0_7_ = in_stack_fffffffffffffe80;
          val1.tag._7_1_ = uVar9;
          in_stack_fffffffffffffee0 = (JSContext *)JS_ToCString((JSContext *)0x10ff79,val1);
          if (in_stack_fffffffffffffee0 == (JSContext *)0x0) goto LAB_0011044b;
          local_104 = unicode_from_utf8((uint8_t *)in_stack_fffffffffffffee0,6,&local_e0);
          JS_FreeCString(in_stack_fffffffffffffe90,(char *)in_stack_fffffffffffffe88.ptr);
        }
        local_ec = local_ec + 1;
        if (0x10ffff < local_104) {
          local_104 = 0xfffd;
        }
        unicode_to_utf8(local_7f,local_104);
        dbuf_put((DynBuf *)in_stack_fffffffffffffe88.ptr,
                 (uint8_t *)CONCAT17(uVar9,in_stack_fffffffffffffe80),
                 CONCAT17(in_stack_fffffffffffffe7f,in_stack_fffffffffffffe78));
        goto LAB_0010f994;
      case 0x4e:
        if (local_3c <= local_ec) goto LAB_001102b4;
        local_ec = local_ec + 1;
        val1_00.u._7_1_ = 0;
        val1_00.u._0_7_ = in_stack_fffffffffffffe78;
        val1_00.tag._0_7_ = in_stack_fffffffffffffe80;
        val1_00.tag._7_1_ = uVar9;
        in_stack_fffffffffffffee0 = (JSContext *)JS_ToCString((JSContext *)0x1101b4,val1_00);
        if (in_stack_fffffffffffffee0 != (JSContext *)0x0) goto LAB_001101c6;
        goto LAB_0011044b;
      }
LAB_0011028f:
      JS_ThrowTypeError(local_38,"invalid conversion specifier in format string");
      goto LAB_0011044b;
    }
LAB_001102de:
    JS_FreeCString(in_stack_fffffffffffffe90,(char *)in_stack_fffffffffffffe88.ptr);
  }
  if (in_stack_ffffffffffffff58 == 0) {
    if (local_50 == (FILE *)0x0) {
      JVar8 = JS_NewStringLen(in_stack_fffffffffffffee0,(char *)buf,buf_len);
      local_90 = JVar8.u;
      local_88 = JVar8.tag;
    }
    else {
      sVar6 = fwrite(local_c0,1,local_b8,local_50);
      local_1c = (undefined4)sVar6;
      local_18 = local_38;
      local_8 = 0;
      local_90._4_4_ = uStack_c;
      local_90.int32 = local_1c;
      local_88 = 0;
      local_10 = local_1c;
    }
  }
  else {
    JVar8 = JS_ThrowOutOfMemory(in_stack_fffffffffffffe90);
    local_90 = JVar8.u;
    local_88 = JVar8.tag;
  }
  dbuf_free((DynBuf *)0x110429);
  local_30 = local_90.int32;
  uStack_2c = local_90._4_4_;
  local_28 = local_88;
LAB_0011046f:
  JVar3.u._4_4_ = uStack_2c;
  JVar3.u.int32 = local_30;
  JVar3.tag = local_28;
  return JVar3;
LAB_001101c6:
  (*buf)(&local_c0,&local_78,in_stack_fffffffffffffee0);
  JS_FreeCString(in_stack_fffffffffffffe90,(char *)in_stack_fffffffffffffe88.ptr);
  goto LAB_0010f994;
}

Assistant:

static JSValue js_printf_internal(JSContext *ctx,
                                  int argc, JSValueConst *argv, FILE *fp)
{
    char fmtbuf[32];
    uint8_t cbuf[UTF8_CHAR_LEN_MAX+1];
    JSValue res;
    DynBuf dbuf;
    const char *fmt_str;
    const uint8_t *fmt, *fmt_end;
    const uint8_t *p;
    char *q;
    int i, c, len, mod;
    size_t fmt_len;
    int32_t int32_arg;
    int64_t int64_arg;
    double double_arg;
    const char *string_arg;
    /* Use indirect call to dbuf_printf to prevent gcc warning */
    int (*dbuf_printf_fun)(DynBuf *s, const char *fmt, ...) = (void*)dbuf_printf;

    js_std_dbuf_init(ctx, &dbuf);

    if (argc > 0) {
        fmt_str = JS_ToCStringLen(ctx, &fmt_len, argv[0]);
        if (!fmt_str)
            goto fail;

        i = 1;
        fmt = (const uint8_t *)fmt_str;
        fmt_end = fmt + fmt_len;
        while (fmt < fmt_end) {
            for (p = fmt; fmt < fmt_end && *fmt != '%'; fmt++)
                continue;
            dbuf_put(&dbuf, p, fmt - p);
            if (fmt >= fmt_end)
                break;
            q = fmtbuf;
            *q++ = *fmt++;  /* copy '%' */
            
            /* flags */
            for(;;) {
                c = *fmt;
                if (c == '0' || c == '#' || c == '+' || c == '-' || c == ' ' ||
                    c == '\'') {
                    if (q >= fmtbuf + sizeof(fmtbuf) - 1)
                        goto invalid;
                    *q++ = c;
                    fmt++;
                } else {
                    break;
                }
            }
            /* width */
            if (*fmt == '*') {
                if (i >= argc)
                    goto missing;
                if (JS_ToInt32(ctx, &int32_arg, argv[i++]))
                    goto fail;
                q += snprintf(q, fmtbuf + sizeof(fmtbuf) - q, "%d", int32_arg);
                fmt++;
            } else {
                while (my_isdigit(*fmt)) {
                    if (q >= fmtbuf + sizeof(fmtbuf) - 1)
                        goto invalid;
                    *q++ = *fmt++;
                }
            }
            if (*fmt == '.') {
                if (q >= fmtbuf + sizeof(fmtbuf) - 1)
                    goto invalid;
                *q++ = *fmt++;
                if (*fmt == '*') {
                    if (i >= argc)
                        goto missing;
                    if (JS_ToInt32(ctx, &int32_arg, argv[i++]))
                        goto fail;
                    q += snprintf(q, fmtbuf + sizeof(fmtbuf) - q, "%d", int32_arg);
                    fmt++;
                } else {
                    while (my_isdigit(*fmt)) {
                        if (q >= fmtbuf + sizeof(fmtbuf) - 1)
                            goto invalid;
                        *q++ = *fmt++;
                    }
                }
            }

            /* we only support the "l" modifier for 64 bit numbers */
            mod = ' ';
            if (*fmt == 'l') {
                mod = *fmt++;
            }
            
            /* type */
            c = *fmt++;
            if (q >= fmtbuf + sizeof(fmtbuf) - 1)
                goto invalid;
            *q++ = c;
            *q = '\0';
            
            switch (c) {
            case 'c':
                if (i >= argc)
                    goto missing;
                if (JS_IsString(argv[i])) {
                    string_arg = JS_ToCString(ctx, argv[i++]);
                    if (!string_arg)
                        goto fail;
                    int32_arg = unicode_from_utf8((uint8_t *)string_arg, UTF8_CHAR_LEN_MAX, &p);
                    JS_FreeCString(ctx, string_arg);
                } else {
                    if (JS_ToInt32(ctx, &int32_arg, argv[i++]))
                        goto fail;
                }
                /* handle utf-8 encoding explicitly */
                if ((unsigned)int32_arg > 0x10FFFF)
                    int32_arg = 0xFFFD;
                /* ignore conversion flags, width and precision */
                len = unicode_to_utf8(cbuf, int32_arg);
                dbuf_put(&dbuf, cbuf, len);
                break;
                
            case 'd':
            case 'i':
            case 'o':
            case 'u':
            case 'x':
            case 'X':
                if (i >= argc)
                    goto missing;
                if (JS_ToInt64Ext(ctx, &int64_arg, argv[i++]))
                    goto fail;
                if (mod == 'l') {
                    /* 64 bit number */
#if defined(_WIN32)
                    if (q >= fmtbuf + sizeof(fmtbuf) - 3)
                        goto invalid;
                    q[2] = q[-1];
                    q[-1] = 'I';
                    q[0] = '6';
                    q[1] = '4';
                    q[3] = '\0';
                    dbuf_printf_fun(&dbuf, fmtbuf, (int64_t)int64_arg);
#else
                    if (q >= fmtbuf + sizeof(fmtbuf) - 2)
                        goto invalid;
                    q[1] = q[-1];
                    q[-1] = q[0] = 'l';
                    q[2] = '\0';
                    dbuf_printf_fun(&dbuf, fmtbuf, (long long)int64_arg);
#endif
                } else {
                    dbuf_printf_fun(&dbuf, fmtbuf, (int)int64_arg);
                }
                break;

            case 's':
                if (i >= argc)
                    goto missing;
                /* XXX: handle strings containing null characters */
                string_arg = JS_ToCString(ctx, argv[i++]);
                if (!string_arg)
                    goto fail;
                dbuf_printf_fun(&dbuf, fmtbuf, string_arg);
                JS_FreeCString(ctx, string_arg);
                break;
                
            case 'e':
            case 'f':
            case 'g':
            case 'a':
            case 'E':
            case 'F':
            case 'G':
            case 'A':
                if (i >= argc)
                    goto missing;
                if (JS_ToFloat64(ctx, &double_arg, argv[i++]))
                    goto fail;
                dbuf_printf_fun(&dbuf, fmtbuf, double_arg);
                break;
                
            case '%':
                dbuf_putc(&dbuf, '%');
                break;
                
            default:
                /* XXX: should support an extension mechanism */
            invalid:
                JS_ThrowTypeError(ctx, "invalid conversion specifier in format string");
                goto fail;
            missing:
                JS_ThrowReferenceError(ctx, "missing argument for conversion specifier");
                goto fail;
            }
        }
        JS_FreeCString(ctx, fmt_str);
    }
    if (dbuf.error) {
        res = JS_ThrowOutOfMemory(ctx);
    } else {
        if (fp) {
            len = fwrite(dbuf.buf, 1, dbuf.size, fp);
            res = JS_NewInt32(ctx, len);
        } else {
            res = JS_NewStringLen(ctx, (char *)dbuf.buf, dbuf.size);
        }
    }
    dbuf_free(&dbuf);
    return res;

fail:
    dbuf_free(&dbuf);
    return JS_EXCEPTION;
}